

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O1

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  archive_string_conv *paVar4;
  
  paVar4 = _a[1].sconv;
  if (paVar4 == (archive_string_conv *)0x0) {
    iVar3 = -0x14;
  }
  else {
    iVar3 = -0x14;
    do {
      pcVar1 = *(code **)&paVar4->from_cp;
      if ((pcVar1 != (code *)0x0) &&
         ((m == (char *)0x0 || (iVar2 = strcmp((char *)paVar4->converter[0],m), iVar2 == 0)))) {
        iVar2 = (*pcVar1)(paVar4,o,v);
        if (m != (char *)0x0) {
          return iVar2;
        }
        if (iVar2 == -0x1e) {
          return -0x1e;
        }
        if (iVar2 == 0) {
          iVar3 = 0;
        }
      }
      paVar4 = (archive_string_conv *)paVar4->to_charset;
    } while (paVar4 != (archive_string_conv *)0x0);
  }
  iVar2 = -0x15;
  if (iVar3 != -0x14) {
    iVar2 = iVar3;
  }
  if (m == (char *)0x0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	(void)_a; /* UNUSED */
	(void)o; /* UNUSED */
	(void)v; /* UNUSED */

	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL)
		return ARCHIVE_WARN - 1;
	return ARCHIVE_WARN;
}